

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeCreateTable(Btree *p,Pgno *piTable,int flags)

{
  int *piVar1;
  BtShared *pBt;
  uint uVar2;
  bool bVar3;
  u8 eType_00;
  uint uVar4;
  int iVar5;
  BtCursor *pBVar6;
  MemPage *pMVar7;
  int iVar8;
  uint nearby;
  int rc;
  u8 eType;
  MemPage *pRoot;
  Pgno pgnoRoot;
  Pgno pgnoMove;
  MemPage *pPageMove;
  int local_60;
  u8 local_59;
  MemPage *local_58;
  uint local_4c;
  MemPage *local_48;
  Pgno local_40;
  uint local_3c;
  MemPage *local_38;
  
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pBt = p->pBt;
  if (pBt->autoVacuum == '\0') {
    iVar8 = allocateBtreePage(pBt,&local_58,&local_4c,1,'\0');
    local_60 = iVar8;
    if (iVar8 != 0) goto LAB_00141a21;
  }
  else {
    for (pBVar6 = pBt->pCursor; pBVar6 != (BtCursor *)0x0; pBVar6 = pBVar6->pNext) {
      pBVar6->curFlags = pBVar6->curFlags & 0xfb;
    }
    sqlite3BtreeGetMeta(p,4,&local_4c);
    if (pBt->nPage < local_4c) {
      bVar3 = false;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12af0,
                  "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
      iVar8 = 0xb;
    }
    else {
      do {
        uVar2 = local_4c;
        nearby = uVar2 + 1;
        uVar4 = 0;
        if (1 < nearby) {
          iVar8 = (uVar2 - 1) - (uVar2 - 1) % (pBt->usableSize / 5 + 1);
          uVar4 = iVar8 + (uint)(iVar8 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
        }
        local_4c = nearby;
      } while ((nearby == uVar4) || (uVar2 == (uint)sqlite3PendingByte / pBt->pageSize));
      iVar8 = allocateBtreePage(pBt,&local_38,&local_3c,nearby,'\x01');
      local_60 = iVar8;
      if (iVar8 == 0) {
        if (local_3c == nearby) {
          local_58 = local_38;
        }
        else {
          local_48 = (MemPage *)CONCAT44(local_48._4_4_,local_3c);
          local_59 = '\0';
          local_40 = 0;
          if (pBt->pCursor == (BtCursor *)0x0) {
            iVar5 = 0;
          }
          else {
            iVar5 = saveCursorsOnList(pBt->pCursor,0,(BtCursor *)0x0);
          }
          local_60 = iVar5;
          if (local_38 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(local_38->pDbPage);
          }
          if ((iVar5 == 0) &&
             (local_60 = btreeGetPage(pBt,nearby,&local_58,0), iVar5 = local_60, local_60 == 0)) {
            local_60 = ptrmapGet(pBt,nearby,&local_59,&local_40);
            eType_00 = local_59;
            if ((byte)(local_59 - 1) < 2) {
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12b20,
                          "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
              local_60 = 0xb;
            }
            pMVar7 = local_58;
            if (local_60 != 0) {
LAB_00141b93:
              iVar5 = local_60;
              if (pMVar7 != (MemPage *)0x0) {
                sqlite3PagerUnrefNotNull(pMVar7->pDbPage);
              }
              goto LAB_00141abb;
            }
            iVar8 = relocatePage(pBt,local_58,eType_00,local_40,(Pgno)local_48,0);
            local_60 = iVar8;
            if (pMVar7 != (MemPage *)0x0) {
              sqlite3PagerUnrefNotNull(pMVar7->pDbPage);
            }
            iVar5 = iVar8;
            if ((iVar8 != 0) ||
               (local_60 = btreeGetPage(pBt,nearby,&local_58,0), iVar5 = local_60, local_60 != 0))
            goto LAB_00141abb;
            local_48 = local_58;
            local_60 = sqlite3PagerWrite(local_58->pDbPage);
            pMVar7 = local_48;
            if (local_60 != 0) goto LAB_00141b93;
            bVar3 = true;
          }
          else {
LAB_00141abb:
            iVar8 = iVar5;
            bVar3 = false;
          }
          if (!bVar3) goto LAB_001419ea;
          local_48 = (MemPage *)CONCAT44(local_48._4_4_,iVar8);
        }
        ptrmapPut(pBt,nearby,'\x01',0,&local_60);
        if ((local_60 == 0) && (local_60 = sqlite3BtreeUpdateMeta(p,4,nearby), local_60 == 0)) {
          bVar3 = true;
          iVar8 = (Pgno)local_48;
          goto LAB_001419ed;
        }
        iVar8 = local_60;
        if (local_58 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(local_58->pDbPage);
        }
      }
LAB_001419ea:
      bVar3 = false;
    }
LAB_001419ed:
    if (!bVar3) goto LAB_00141a21;
  }
  pMVar7 = local_58;
  zeroPage(local_58,(flags & 1U) * 3 + 10);
  if (pMVar7->pDbPage != (DbPage *)0x0) {
    sqlite3PagerUnrefNotNull(pMVar7->pDbPage);
  }
  *piTable = local_4c;
  iVar8 = 0;
LAB_00141a21:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return iVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCreateTable(Btree *p, Pgno *piTable, int flags){
  int rc;
  sqlite3BtreeEnter(p);
  rc = btreeCreateTable(p, piTable, flags);
  sqlite3BtreeLeave(p);
  return rc;
}